

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall
OpenMD::VectorAccumulator::get95percentConfidenceInterval(VectorAccumulator *this,ResultType *ret)

{
  undefined8 uVar1;
  double *pdVar2;
  Vector<double,_3U> *in_RSI;
  long in_RDI;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ResultType sd;
  Vector<double,_3U> *this_00;
  VectorAccumulator *in_stack_ffffffffffffff90;
  double dVar8;
  Vector<double,_3U> local_28;
  Vector<double,_3U> *local_10;
  
  this_00 = &local_28;
  local_10 = in_RSI;
  Vector3<double>::Vector3((Vector3<double> *)0x2f8756);
  getStdDev(in_stack_ffffffffffffff90,(ResultType *)this_00);
  pdVar2 = Vector<double,_3U>::operator[](this_00,0);
  dVar4 = *pdVar2;
  dVar8 = 1.96;
  uVar1 = *(undefined8 *)(in_RDI + 8);
  auVar5._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._12_4_ = 0x45300000;
  dVar3 = sqrt((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  pdVar2 = Vector<double,_3U>::operator[](local_10,0);
  *pdVar2 = (dVar4 * 1.96) / dVar3;
  pdVar2 = Vector<double,_3U>::operator[](this_00,1);
  dVar4 = *pdVar2 * dVar8;
  uVar1 = *(undefined8 *)(in_RDI + 8);
  auVar6._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar6._0_8_ = uVar1;
  auVar6._12_4_ = 0x45300000;
  dVar3 = sqrt((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  pdVar2 = Vector<double,_3U>::operator[](local_10,1);
  *pdVar2 = dVar4 / dVar3;
  pdVar2 = Vector<double,_3U>::operator[](this_00,2);
  dVar4 = *pdVar2;
  uVar1 = *(undefined8 *)(in_RDI + 8);
  auVar7._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._12_4_ = 0x45300000;
  dVar3 = sqrt((auVar7._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  pdVar2 = Vector<double,_3U>::operator[](local_10,2);
  *pdVar2 = (dVar4 * dVar8) / dVar3;
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      ResultType sd;
      this->getStdDev(sd);
      ret[0] = 1.960 * sd[0] / sqrt(RealType(Count_));
      ret[1] = 1.960 * sd[1] / sqrt(RealType(Count_));
      ret[2] = 1.960 * sd[2] / sqrt(RealType(Count_));
      return;
    }